

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_stress.c
# Opt level: O0

void client(void *arg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int local_28;
  int cli_sock;
  int i;
  int sz_msg;
  char msg [3];
  void *pvStack_18;
  int bytes;
  intptr_t id;
  void *arg_local;
  
  i._1_1_ = (char)((long)arg % 0x1a) + 'A';
  i._2_1_ = 'a';
  i._3_1_ = 0;
  pvStack_18 = arg;
  sVar4 = strlen((char *)((long)&i + 1));
  iVar1 = (int)sVar4 + 1;
  local_28 = 0;
  while( true ) {
    if (9 < local_28) {
      return;
    }
    iVar2 = nn_socket(1,0x50);
    i._2_1_ = (char)(local_28 % 0x1a) + 'a';
    if (iVar2 < 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","cli_sock >= 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc_stress.c"
              ,0x58);
      fflush(_stderr);
      nn_err_abort();
    }
    iVar3 = nn_connect(iVar2,"ipc://test-stress.ipc");
    if (iVar3 < 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_connect(cli_sock, SOCKET_ADDRESS) >= 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc_stress.c"
              ,0x59);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_sleep(0x32);
    sz_msg = nn_send(iVar2,(long)&i + 1,(long)iVar1,0);
    nn_sleep(100);
    if (sz_msg != iVar1) break;
    nn_close(iVar2);
    local_28 = local_28 + 1;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","bytes == sz_msg",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc_stress.c"
          ,0x5f);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void client(void *arg)
{
    intptr_t id = (intptr_t)arg;
    int bytes;
    char msg[3];
    int sz_msg;
    int i;

    msg[0] = 'A' + id%26;
    msg[1] = 'a';
    msg[2] = '\0';
    sz_msg = strlen (msg) + 1; // '\0' too

    for (i = 0; i < TEST_LOOPS; i++) {
        int cli_sock = nn_socket(AF_SP, NN_PUSH);
        msg[1] = 'a' + i%26;
        nn_assert(cli_sock >= 0);
        nn_assert(nn_connect(cli_sock, SOCKET_ADDRESS) >= 0);
        /*  Give time to allow for connect to establish. */
        nn_sleep(50);
        bytes = nn_send(cli_sock, msg, sz_msg, 0);
        /*  This would better be handled via semaphore or condvar. */
        nn_sleep(100);
        nn_assert(bytes == sz_msg);
        nn_close(cli_sock);
    }
}